

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O0

void __thiscall Fl_Type::move_before(Fl_Type *this,Fl_Type *g)

{
  bool bVar1;
  Fl_Type *pFVar2;
  int iVar3;
  Fl_Type *local_40;
  Fl_Type *l;
  Fl_Type *n;
  Fl_Type *g_local;
  Fl_Type *this_local;
  
  if (this->level != g->level) {
    printf("move_before levels don\'t match! %d %d\n",(ulong)(uint)this->level,(ulong)(uint)g->level
          );
  }
  l = this->next;
  while( true ) {
    bVar1 = false;
    if (l != (Fl_Type *)0x0) {
      bVar1 = this->level < l->level;
    }
    if (!bVar1) break;
    l = l->next;
  }
  if (l != g) {
    if (l == (Fl_Type *)0x0) {
      local_40 = last;
    }
    else {
      local_40 = l->prev;
    }
    this->prev->next = l;
    if (l == (Fl_Type *)0x0) {
      last = this->prev;
    }
    else {
      l->prev = this->prev;
    }
    this->prev = g->prev;
    local_40->next = g;
    pFVar2 = this;
    if (this->prev != (Fl_Type *)0x0) {
      this->prev->next = this;
      pFVar2 = first;
    }
    first = pFVar2;
    g->prev = local_40;
    if ((this->parent != (Fl_Type *)0x0) && (iVar3 = (*this->_vptr_Fl_Type[0x17])(), iVar3 != 0)) {
      (*this->parent->_vptr_Fl_Type[9])(this->parent,this,g);
    }
    Fl_Browser_::inserting(&widget_browser->super_Fl_Browser_,g,this);
    Fl_Browser_::display(&widget_browser->super_Fl_Browser_,this);
    Fl_Widget::redraw((Fl_Widget *)widget_browser);
  }
  return;
}

Assistant:

void Fl_Type::move_before(Fl_Type* g) {
  if (level != g->level) printf("move_before levels don't match! %d %d\n",
				level, g->level);
  Fl_Type* n;
  for (n = next; n && n->level > level; n = n->next) {/*empty*/}
  if (n == g) return;
  Fl_Type *l = n ? n->prev : Fl_Type::last;
  prev->next = n;
  if (n) n->prev = prev; else Fl_Type::last = prev;
  prev = g->prev;
  l->next = g;
  if (prev) prev->next = this; else Fl_Type::first = this;
  g->prev = l;
  if (parent && is_widget()) parent->move_child(this,g);
  widget_browser->inserting(g, this);
  widget_browser->display(this);
  widget_browser->redraw();
}